

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_interpreter_evaluateScript
          (sysbvm_context_t *context,sysbvm_tuple_t script,sysbvm_tuple_t name,
          sysbvm_tuple_t language)

{
  sysbvm_stackFrameRecord_t local_78;
  undefined8 local_68;
  sysbvm_tuple_t *local_60;
  sysbvm_tuple_t local_50;
  sysbvm_tuple_t local_48;
  sysbvm_tuple_t local_40;
  undefined8 local_38;
  sysbvm_tuple_t sStack_30;
  sysbvm_tuple_t local_28;
  sysbvm_tuple_t sStack_20;
  
  local_60 = &local_50;
  local_38 = 0;
  sStack_30 = 0;
  local_28 = 0;
  sStack_20 = 0;
  local_78.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_78.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_78._12_4_ = 0;
  local_68 = 7;
  local_50 = script;
  local_48 = name;
  local_40 = language;
  sysbvm_stackFrame_pushRecord(&local_78);
  sStack_30 = sysbvm_sourceCode_create(context,local_50,0,local_48,local_40);
  local_28 = sysbvm_environment_createDefaultForSourceCodeEvaluation(context,sStack_30);
  sStack_20 = sysbvm_interpreter_validateThenAnalyzeAndEvaluateSourceCodeWithEnvironment
                        (context,local_28,sStack_30);
  sysbvm_stackFrame_popRecord(&local_78);
  return sStack_20;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_evaluateScript(sysbvm_context_t *context, sysbvm_tuple_t script, sysbvm_tuple_t name, sysbvm_tuple_t language)
{
    struct {
        sysbvm_tuple_t script;
        sysbvm_tuple_t name;
        sysbvm_tuple_t language;
        sysbvm_tuple_t sourceLanguage;
        sysbvm_tuple_t sourceCode;
        sysbvm_tuple_t sourceEnvironment;
        sysbvm_tuple_t result;
    } gcFrame = {
        .script = script,
        .name = name,
        .language = language
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.sourceCode = sysbvm_sourceCode_create(context, gcFrame.script, SYSBVM_NULL_TUPLE, gcFrame.name, gcFrame.language);
    gcFrame.sourceEnvironment = sysbvm_environment_createDefaultForSourceCodeEvaluation(context, gcFrame.sourceCode);
    gcFrame.result = sysbvm_interpreter_validateThenAnalyzeAndEvaluateSourceCodeWithEnvironment(context, gcFrame.sourceEnvironment, gcFrame.sourceCode);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}